

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int ddUpdateMtrTree(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  int iVar1;
  MtrHalfWord local_4c;
  int local_48;
  int minIndex;
  int maxLevel;
  int minLevel;
  int level;
  int index;
  int size;
  int i;
  int *invperm_local;
  int *perm_local;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  if (treenode == (MtrNode *)0x0) {
    table_local._4_4_ = 1;
  }
  else {
    minIndex = 0x7fffffff;
    local_48 = 0;
    local_4c = 0xffffffff;
    for (index = treenode->low; (uint)index < treenode->low + treenode->size; index = index + 1) {
      iVar1 = perm[table->invperm[index]];
      if (iVar1 < minIndex) {
        local_4c = table->invperm[index];
        minIndex = iVar1;
      }
      if (local_48 < iVar1) {
        local_48 = iVar1;
      }
    }
    if (local_4c == 0xffffffff) {
      table_local._4_4_ = 0;
    }
    else if ((local_48 - minIndex) + 1U == treenode->size) {
      treenode->low = minIndex;
      treenode->index = local_4c;
      if ((treenode->child == (MtrNode *)0x0) ||
         (iVar1 = ddUpdateMtrTree(table,treenode->child,perm,invperm), iVar1 != 0)) {
        if ((treenode->younger == (MtrNode *)0x0) ||
           (iVar1 = ddUpdateMtrTree(table,treenode->younger,perm,invperm), iVar1 != 0)) {
          table_local._4_4_ = 1;
        }
        else {
          table_local._4_4_ = 0;
        }
      }
      else {
        table_local._4_4_ = 0;
      }
    }
    else {
      table_local._4_4_ = 0;
    }
  }
  return table_local._4_4_;
}

Assistant:

static int
ddUpdateMtrTree(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel, minIndex;

    if (treenode == NULL) return(1);

    minLevel = CUDD_MAXINDEX;
    maxLevel = 0;
    minIndex = -1;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel) {
            minLevel = level;
            minIndex = index;
        }
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (minIndex == -1) return(0);
    if (size == treenode->size) {
        treenode->low = minLevel;
        treenode->index = minIndex;
    } else {
        return(0);
    }

    if (treenode->child != NULL) {
        if (!ddUpdateMtrTree(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddUpdateMtrTree(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}